

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O0

void __thiscall
Assimp::Q3BSPFileImporter::createTriangleTopology
          (Q3BSPFileImporter *this,Q3BSPModel *pModel,sQ3BSPFace *pQ3BSPFace,aiMesh *pMesh,
          uint *faceIdx,uint *vertIdx)

{
  int iVar1;
  value_type psVar2;
  undefined1 auVar3 [16];
  aiFace *paVar4;
  ulong uVar5;
  uint *puVar6;
  const_reference pvVar7;
  size_type sVar8;
  const_reference ppsVar9;
  sQ3BSPVertex *pVertex;
  size_t index;
  size_t i;
  size_t idx;
  uint *vertIdx_local;
  uint *faceIdx_local;
  aiMesh *pMesh_local;
  sQ3BSPFace *pQ3BSPFace_local;
  Q3BSPModel *pModel_local;
  Q3BSPFileImporter *this_local;
  
  if (pMesh->mNumFaces <= *faceIdx) {
    __assert_fail("faceIdx < pMesh->mNumFaces",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Q3BSP/Q3BSPFileImporter.cpp"
                  ,0x178,
                  "void Assimp::Q3BSPFileImporter::createTriangleTopology(const Q3BSP::Q3BSPModel *, sQ3BSPFace *, aiMesh *, unsigned int &, unsigned int &)"
                 );
  }
  paVar4 = getNextFace(this,pMesh,faceIdx);
  this->m_pCurrentFace = paVar4;
  if (this->m_pCurrentFace != (aiFace *)0x0) {
    this->m_pCurrentFace->mNumIndices = 3;
    auVar3 = ZEXT416(this->m_pCurrentFace->mNumIndices) * ZEXT816(4);
    uVar5 = auVar3._0_8_;
    if (auVar3._8_8_ != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    puVar6 = (uint *)operator_new__(uVar5);
    this->m_pCurrentFace->mIndices = puVar6;
    i = 0;
    for (index = 0; index < (ulong)(long)pQ3BSPFace->iNumOfFaceVerts; index = index + 1) {
      iVar1 = pQ3BSPFace->iVertexIndex;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&pModel->m_Indices,(long)pQ3BSPFace->iFaceVertexIndex + index);
      uVar5 = (ulong)(iVar1 + *pvVar7);
      sVar8 = std::
              vector<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
              ::size(&pModel->m_Vertices);
      if (uVar5 < sVar8) {
        ppsVar9 = std::
                  vector<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
                  ::operator[](&pModel->m_Vertices,uVar5);
        psVar2 = *ppsVar9;
        if (psVar2 != (value_type)0x0) {
          if (2 < i) {
            i = 0;
            paVar4 = getNextFace(this,pMesh,faceIdx);
            this->m_pCurrentFace = paVar4;
            if (this->m_pCurrentFace != (aiFace *)0x0) {
              this->m_pCurrentFace->mNumIndices = 3;
              puVar6 = (uint *)operator_new__(0xc);
              this->m_pCurrentFace->mIndices = puVar6;
              *this->m_pCurrentFace->mIndices = *vertIdx;
            }
          }
          aiVector3t<float>::Set
                    (pMesh->mVertices + *vertIdx,(psVar2->vPosition).x,(psVar2->vPosition).y,
                     (psVar2->vPosition).z);
          aiVector3t<float>::Set
                    (pMesh->mNormals + *vertIdx,(psVar2->vNormal).x,(psVar2->vNormal).y,
                     (psVar2->vNormal).z);
          aiVector3t<float>::Set
                    (pMesh->mTextureCoords[0] + *vertIdx,(psVar2->vTexCoord).x,(psVar2->vTexCoord).y
                     ,0.0);
          aiVector3t<float>::Set
                    (pMesh->mTextureCoords[1] + *vertIdx,(psVar2->vLightmap).x,(psVar2->vLightmap).y
                     ,0.0);
          *vertIdx = *vertIdx + 1;
          i = i + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void Q3BSPFileImporter::createTriangleTopology( const Q3BSP::Q3BSPModel *pModel, sQ3BSPFace *pQ3BSPFace,
        aiMesh* pMesh, unsigned int &faceIdx, unsigned int &vertIdx ) {
    ai_assert( faceIdx < pMesh->mNumFaces );

    m_pCurrentFace = getNextFace( pMesh, faceIdx );
    if ( nullptr == m_pCurrentFace ) {
        return;
    }

    m_pCurrentFace->mNumIndices = 3;
    m_pCurrentFace->mIndices = new unsigned int[ m_pCurrentFace->mNumIndices ];

    size_t idx( 0 );
    for ( size_t i = 0; i < (size_t) pQ3BSPFace->iNumOfFaceVerts; ++i ) {
        const size_t index = pQ3BSPFace->iVertexIndex + pModel->m_Indices[ pQ3BSPFace->iFaceVertexIndex + i ];
        if ( index >= pModel->m_Vertices.size() ) {
            continue;
        }

        sQ3BSPVertex *pVertex = pModel->m_Vertices[ index ];
        if ( nullptr == pVertex ) {
            continue;
        }
        if (idx > 2) {
            idx = 0;
            m_pCurrentFace = getNextFace(pMesh, faceIdx);
            if (nullptr != m_pCurrentFace) {
                m_pCurrentFace->mNumIndices = 3;
                m_pCurrentFace->mIndices = new unsigned int[3];
                m_pCurrentFace->mIndices[ idx ] = vertIdx;
            }
        }

        pMesh->mVertices[ vertIdx ].Set( pVertex->vPosition.x, pVertex->vPosition.y, pVertex->vPosition.z );
        pMesh->mNormals[ vertIdx ].Set( pVertex->vNormal.x, pVertex->vNormal.y, pVertex->vNormal.z );

        pMesh->mTextureCoords[ 0 ][ vertIdx ].Set( pVertex->vTexCoord.x, pVertex->vTexCoord.y, 0.0f );
        pMesh->mTextureCoords[ 1 ][ vertIdx ].Set( pVertex->vLightmap.x, pVertex->vLightmap.y, 0.0f );

        vertIdx++;
        idx++;
    }
}